

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

int __thiscall
Centaurus::ATNMachine<wchar_t>::count_incoming_edges(ATNMachine<wchar_t> *this,int index,int *where)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference this_00;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *this_01;
  reference this_02;
  ATNTransition<wchar_t> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  *__range3;
  int i;
  int count;
  int *where_local;
  int index_local;
  ATNMachine<wchar_t> *this_local;
  
  __range3._4_4_ = 0;
  __range3._0_4_ = 0;
  while( true ) {
    sVar3 = std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
            ::size(&this->m_nodes);
    if (sVar3 <= (ulong)(long)(int)__range3) break;
    this_00 = std::
              vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::at
                        (&this->m_nodes,(long)(int)__range3);
    this_01 = ATNNode<wchar_t>::get_transitions(this_00);
    __end0 = std::
             vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
             ::begin(this_01);
    t = (ATNTransition<wchar_t> *)
        std::
        vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
        ::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0,(__normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
                                  *)&t);
      if (!bVar1) break;
      this_02 = __gnu_cxx::
                __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
                ::operator*(&__end0);
      iVar2 = ATNTransition<wchar_t>::dest(this_02);
      if (iVar2 == index) {
        *where = (int)__range3;
        __range3._4_4_ = __range3._4_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::ATNTransition<wchar_t>_*,_std::vector<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>_>
      ::operator++(&__end0);
    }
    __range3._0_4_ = (int)__range3 + 1;
  }
  if (__range3._4_4_ != 1) {
    *where = -1;
  }
  return __range3._4_4_;
}

Assistant:

int count_incoming_edges(int index, int& where) const
    {
        int count = 0;
        for (int i = 0; i < m_nodes.size(); i++)
        {
            for (const auto& t : m_nodes.at(i).get_transitions())
            {
                if (t.dest() == index)
                {
                    where = i;
                    count++;
                    //break;  //Overlapping edges should be counted as one.
                }
            }
        }
        if (count != 1) where = -1;
        return count;
    }